

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generation_iterator.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e8c5d::GenerationIterator::add_transaction(GenerationIterator *this)

{
  element_type_conflict2 *peVar1;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> local_78;
  undefined1 local_60 [8];
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  GenerationIterator *this_local;
  
  transaction.lock_._32_8_ = this;
  pstore::begin((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)local_60,&this->db_);
  pstore::transaction_base::alloc_rw<int,void>(&local_78,(transaction_base *)local_60,1);
  peVar1 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_78);
  *peVar1 = 0x25;
  std::pair<std::shared_ptr<int>,_pstore::typed_address<int>_>::~pair(&local_78);
  pstore::transaction_base::commit((transaction_base *)local_60);
  pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>::~transaction
            ((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)local_60);
  return;
}

Assistant:

void add_transaction () {
            auto transaction = pstore::begin (db_);
            *(transaction.alloc_rw<int> ().first) = 37;
            transaction.commit ();
        }